

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

obj * gold_at(level *lev,int x,int y)

{
  obj *poVar1;
  vptrs *pvVar2;
  
  pvVar2 = (vptrs *)(lev->objects[x] + y);
  while( true ) {
    poVar1 = pvVar2->v_nexthere;
    if ((poVar1 == (obj *)0x0) || (poVar1->oclass == '\f')) break;
    pvVar2 = &poVar1->v;
  }
  return poVar1;
}

Assistant:

struct obj *gold_at(struct level *lev, int x, int y)
{
	struct obj *obj = lev->objects[x][y];
	while (obj) {
	    if (obj->oclass == COIN_CLASS) return obj;
	    obj = obj->nexthere;
	}
	return NULL;
}